

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

char * flatcc_builder_append_string(flatcc_builder_t *B,char *s,size_t len)

{
  int iVar1;
  size_t len_local;
  char *s_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type == 6) {
    iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)len,0xffffffff);
    if (iVar1 == 0) {
      B_local = (flatcc_builder_t *)push_ds_copy(B,s,(flatbuffers_uoffset_t)len);
    }
    else {
      B_local = (flatcc_builder_t *)0x0;
    }
    return (char *)B_local;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x3db,
                "char *flatcc_builder_append_string(flatcc_builder_t *, const char *, size_t)");
}

Assistant:

char *flatcc_builder_append_string(flatcc_builder_t *B, const char *s, size_t len)
{
    check(frame(type) == flatcc_builder_string, "expected string frame");
    if (vector_count_add(B, (uoffset_t)len, max_string_len)) {
        return 0;
    }
    return push_ds_copy(B, s, (uoffset_t)len);
}